

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O2

bool node::WriteSnapshotBaseBlockhash(Chainstate *snapshot_chainstate)

{
  long lVar1;
  uint __line;
  int iVar2;
  CCoinsViewDB *this;
  FILE *pFVar3;
  bool bVar4;
  char *__assertion;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  AutoFile local_d8;
  string local_b8;
  path local_98;
  path write_to;
  optional<fs::path> chaindir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((snapshot_chainstate->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
      _M_payload.super__Optional_payload_base<uint256>._M_engaged == false) {
    __assertion = "snapshot_chainstate.m_from_snapshot_blockhash";
    __line = 0x1a;
LAB_003ea83b:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
                  ,__line,"bool node::WriteSnapshotBaseBlockhash(Chainstate &)");
  }
  this = Chainstate::CoinsDB(snapshot_chainstate);
  CCoinsViewDB::StoragePath(&chaindir,this);
  if (chaindir.super__Optional_base<fs::path,_false,_false>._M_payload.
      super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
      _M_engaged == false) {
    __assertion = "chaindir";
    __line = 0x1d;
    goto LAB_003ea83b;
  }
  std::filesystem::__cxx11::path::path(&local_98,(path *)&chaindir);
  fs::operator/(&write_to,(path *)&local_98,(path *)SNAPSHOT_BLOCKHASH_FILENAME);
  std::filesystem::__cxx11::path::~path(&local_98);
  pFVar3 = fsbridge::fopen((char *)&write_to,"wb");
  local_d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8.m_file = (FILE *)pFVar3;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xffffffffffffff08);
  if (pFVar3 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_b8,&write_to.super_path);
    logging_function_00._M_str = "WriteSnapshotBaseBlockhash";
    logging_function_00._M_len = 0x1a;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file_00._M_len = 0x5f;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x24,
               I2P|VALIDATION|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ESTIMATEFEE|RPC|ZMQ|BENCH|NET,
               (Level)&local_b8,in_stack_ffffffffffffff00,args);
  }
  else {
    pFVar3 = (FILE *)&local_d8;
    base_blob<256U>::Serialize<AutoFile>
              ((base_blob<256U> *)&snapshot_chainstate->m_from_snapshot_blockhash,(AutoFile *)pFVar3
              );
    iVar2 = AutoFile::fclose(&local_d8,pFVar3);
    if (iVar2 == 0) {
      bVar4 = true;
      goto LAB_003ea7c3;
    }
    std::filesystem::__cxx11::path::string(&local_b8,&write_to.super_path);
    logging_function._M_str = "WriteSnapshotBaseBlockhash";
    logging_function._M_len = 0x1a;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file._M_len = 0x5f;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x2b,
               I2P|VALIDATION|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ESTIMATEFEE|RPC|WALLETDB|ZMQ|
               BENCH,(Level)&local_b8,in_stack_ffffffffffffff00,args);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  bVar4 = false;
LAB_003ea7c3:
  AutoFile::~AutoFile(&local_d8);
  std::filesystem::__cxx11::path::~path(&write_to.super_path);
  std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&chaindir);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteSnapshotBaseBlockhash(Chainstate& snapshot_chainstate)
{
    AssertLockHeld(::cs_main);
    assert(snapshot_chainstate.m_from_snapshot_blockhash);

    const std::optional<fs::path> chaindir = snapshot_chainstate.CoinsDB().StoragePath();
    assert(chaindir); // Sanity check that chainstate isn't in-memory.
    const fs::path write_to = *chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;

    FILE* file{fsbridge::fopen(write_to, "wb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for writing: %s\n",
                  fs::PathToString(write_to));
        return false;
    }
    afile << *snapshot_chainstate.m_from_snapshot_blockhash;

    if (afile.fclose() != 0) {
        LogPrintf("[snapshot] failed to close base blockhash file %s after writing\n",
                  fs::PathToString(write_to));
        return false;
    }
    return true;
}